

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void thumb_tr_translate_insn(DisasContextBase *dcbase,CPUState *cpu)

{
  uc_struct *uc_00;
  TCGContext_conflict1 *tcg_ctx_00;
  CPUARMState_conflict *env_00;
  _Bool _Var1;
  _Bool _Var2;
  uint16_t uVar3;
  uint16_t uVar4;
  int iVar5;
  uint uVar6;
  uint32_t cond;
  uint32_t insn2;
  uint32_t insn_size;
  _Bool is_16bit;
  uint32_t insn;
  CPUARMState_conflict *env;
  TCGContext_conflict1 *tcg_ctx;
  uc_struct_conflict2 *uc;
  DisasContextBase *__mptr;
  DisasContext_conflict1 *dc;
  CPUState *cpu_local;
  DisasContextBase *dcbase_local;
  
  uc_00 = (uc_struct *)dcbase[8].pc_next;
  tcg_ctx_00 = (TCGContext_conflict1 *)uc_00->tcg_ctx;
  env_00 = (CPUARMState_conflict *)cpu->env_ptr;
  _Var1 = arm_pre_translate_insn((DisasContext_conflict1 *)dcbase);
  if (!_Var1) {
    iVar5 = uc_addr_is_exit(uc_00,dcbase->pc_next);
    if (iVar5 == 0) {
      dcbase[1].pc_first = dcbase->pc_next;
      uVar3 = arm_lduw_code(env_00,dcbase->pc_next,*(int *)((long)&dcbase[2].pc_first + 4) != 0);
      insn_size = (uint32_t)uVar3;
      _Var1 = thumb_insn_is_16bit((DisasContext_conflict1 *)dcbase,(uint32_t)dcbase->pc_next,
                                  insn_size);
      dcbase->pc_next = dcbase->pc_next + 2;
      if (!_Var1) {
        uVar4 = arm_lduw_code(env_00,dcbase->pc_next,*(int *)((long)&dcbase[2].pc_first + 4) != 0);
        insn_size = CONCAT22(uVar3,uVar4);
        dcbase->pc_next = dcbase->pc_next + 2;
      }
      dcbase[1].is_jmp = insn_size;
      if (((*(int *)&dcbase[2].tb != 0) &&
          (_Var2 = thumb_insn_is_unconditional((DisasContext_conflict1 *)dcbase,insn_size), !_Var2))
         && (uVar6 = *(uint *)((long)&dcbase[2].tb + 4), uVar6 < 0xe)) {
        arm_skip_unless((DisasContext_conflict1 *)dcbase,uVar6);
      }
      uc_00->no_exit_request = *(int *)&dcbase[2].tb != 0;
      uVar6 = 4;
      if (_Var1) {
        uVar6 = 2;
      }
      _Var2 = _hook_exists_bounded(uc_00->hook[2].head,dcbase->pc_next - (ulong)uVar6);
      if (_Var2) {
        gen_set_pc_im((DisasContext_conflict1 *)dcbase,dcbase->pc_next - (ulong)uVar6);
        if ((uc_00->no_exit_request & 1U) == 0) {
          gen_uc_tracecode(tcg_ctx_00,uVar6,2,uc_00,dcbase->pc_next - (ulong)uVar6);
        }
        else {
          gen_uc_tracecode(tcg_ctx_00,uVar6,0x42,uc_00,dcbase->pc_next - (ulong)uVar6);
        }
        check_exit_request_aarch64(tcg_ctx_00);
      }
      if (_Var1) {
        disas_thumb_insn((DisasContext_conflict1 *)dcbase,insn_size);
      }
      else {
        disas_thumb2_insn((DisasContext_conflict1 *)dcbase,insn_size);
      }
      if (*(int *)&dcbase[2].tb != 0) {
        *(uint *)((long)&dcbase[2].tb + 4) =
             *(uint *)((long)&dcbase[2].tb + 4) & 0xe | *(int *)&dcbase[2].tb >> 4 & 1U;
        *(uint *)&dcbase[2].tb = (*(uint *)&dcbase[2].tb & 0xf) << 1;
        if (*(int *)&dcbase[2].tb == 0) {
          *(undefined4 *)((long)&dcbase[2].tb + 4) = 0;
        }
      }
      arm_post_translate_insn((DisasContext_conflict1 *)dcbase);
      if ((dcbase->is_jmp == DISAS_NEXT) &&
         (((ulong)(long)-(int)*(undefined8 *)&uc_00->init_target_page->mask <=
           dcbase->pc_next - dcbase[1].pc_next ||
          (((ulong)(long)(-3 - (int)*(undefined8 *)&uc_00->init_target_page->mask) <=
            dcbase->pc_next - dcbase[1].pc_next &&
           (_Var1 = insn_crosses_page(env_00,(DisasContext_conflict1 *)dcbase), _Var1)))))) {
        dcbase->is_jmp = DISAS_TOO_MANY;
      }
    }
    else {
      dcbase->is_jmp = DISAS_TARGET_2;
    }
  }
  return;
}

Assistant:

static void thumb_tr_translate_insn(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = dc->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    CPUARMState *env = cpu->env_ptr;
    uint32_t insn;
    bool is_16bit;
    uint32_t insn_size;

    if (arm_pre_translate_insn(dc)) {
        return;
    }

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(uc, dcbase->pc_next)) {
        // imitate WFI instruction to halt emulation
        dcbase->is_jmp = DISAS_WFI;
        return;
    }

    dc->pc_curr = dc->base.pc_next;
    insn = arm_lduw_code(env, dc->base.pc_next, dc->sctlr_b);
    is_16bit = thumb_insn_is_16bit(dc, dc->base.pc_next, insn);
    dc->base.pc_next += 2;
    if (!is_16bit) {
        uint32_t insn2 = arm_lduw_code(env, dc->base.pc_next, dc->sctlr_b);

        insn = insn << 16 | insn2;
        dc->base.pc_next += 2;
    }
    dc->insn = insn;

    if (dc->condexec_mask && !thumb_insn_is_unconditional(dc, insn)) {
        uint32_t cond = dc->condexec_cond;

        /*
         * Conditionally skip the insn. Note that both 0xe and 0xf mean
         * "always"; 0xf is not "never".
         */
        if (cond < 0x0e) {
            arm_skip_unless(dc, cond);
        }
    }
    
    // Unicorn:
    //   We can't stop in the middle of the IT block.
    //   In other words, treat the whole IT block as
    //   a single instruction.
    uc->no_exit_request = (dc->condexec_mask != 0);

    // Unicorn: trace this instruction on request
    insn_size = is_16bit ? 2 : 4;
    if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_CODE, dc->base.pc_next - insn_size)) {
        
        // Sync PC in advance
        gen_set_pc_im(dc, dc->base.pc_next - insn_size);

        if (uc->no_exit_request) {
            gen_uc_tracecode(tcg_ctx, insn_size, UC_HOOK_CODE_IDX | UC_HOOK_FLAG_NO_STOP, uc, dc->base.pc_next - insn_size);
        } else {
            gen_uc_tracecode(tcg_ctx, insn_size, UC_HOOK_CODE_IDX, uc, dc->base.pc_next - insn_size);
        }
        // the callback might want to stop emulation immediately
        check_exit_request(tcg_ctx);
    }

    if (is_16bit) {
        disas_thumb_insn(dc, insn);
    } else {
        disas_thumb2_insn(dc, insn);
    }

    /* Advance the Thumb condexec condition.  */
    if (dc->condexec_mask) {
        dc->condexec_cond = ((dc->condexec_cond & 0xe) |
                             ((dc->condexec_mask >> 4) & 1));
        dc->condexec_mask = (dc->condexec_mask << 1) & 0x1f;
        if (dc->condexec_mask == 0) {
            dc->condexec_cond = 0;
        }
    }

    arm_post_translate_insn(dc);

    /* Thumb is a variable-length ISA.  Stop translation when the next insn
     * will touch a new page.  This ensures that prefetch aborts occur at
     * the right place.
     *
     * We want to stop the TB if the next insn starts in a new page,
     * or if it spans between this page and the next. This means that
     * if we're looking at the last halfword in the page we need to
     * see if it's a 16-bit Thumb insn (which will fit in this TB)
     * or a 32-bit Thumb insn (which won't).
     * This is to avoid generating a silly TB with a single 16-bit insn
     * in it at the end of this page (which would execute correctly
     * but isn't very efficient).
     */
    if (dc->base.is_jmp == DISAS_NEXT
        && (dc->base.pc_next - dc->page_start >= TARGET_PAGE_SIZE
            || (dc->base.pc_next - dc->page_start >= TARGET_PAGE_SIZE - 3
                && insn_crosses_page(env, dc)))) {
        dc->base.is_jmp = DISAS_TOO_MANY;
    }
}